

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean.cpp
# Opt level: O1

Variable __thiscall
LiteScript::_Type_BOOLEAN::OAssign(_Type_BOOLEAN *this,Variable *src,Variable *dest)

{
  undefined1 uVar1;
  bool bVar2;
  Object *pOVar3;
  Type *pTVar4;
  Variable *in_RCX;
  uint *extraout_RDX;
  Variable VVar5;
  Variable VStack_38;
  
  pOVar3 = Variable::operator->(in_RCX);
  pTVar4 = Object::GetType(pOVar3);
  bVar2 = Type::operator!=(pTVar4,(Type *)src);
  pOVar3 = Variable::operator->(in_RCX);
  if (bVar2) {
    pTVar4 = Object::GetType(pOVar3);
    pOVar3 = Variable::operator*(dest);
    (*pTVar4->_vptr_Type[1])(pTVar4,pOVar3);
    pOVar3 = Variable::operator->(dest);
    pTVar4 = Object::GetType(pOVar3);
    (*pTVar4->_vptr_Type[3])(&VStack_38,pTVar4,dest);
    Variable::~Variable(&VStack_38);
  }
  else {
    uVar1 = *pOVar3->data;
    pOVar3 = Variable::operator->(dest);
    *(undefined1 *)pOVar3->data = uVar1;
  }
  Variable::Variable((Variable *)this,dest);
  VVar5.nb_ref = extraout_RDX;
  VVar5.obj = (Object *)this;
  return VVar5;
}

Assistant:

LiteScript::Variable LiteScript::_Type_BOOLEAN::OAssign(LiteScript::Variable& src, const LiteScript::Variable& dest) const {
    if (dest->GetType() != *this) {
        dest->GetType().AssignObject(*src);
        src->GetType().OAssign(src, dest);
    }
    else {
        src->GetData<bool>() = dest->GetData<bool>();
    }
    return Variable(src);
}